

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polygon.h
# Opt level: O2

Vector __thiscall anurbs::Polygon::vertex(Polygon *this,Index index)

{
  pointer pMVar1;
  pointer pMVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long in_RDX;
  long *plVar7;
  double in_XMM1_Qa;
  Vector VVar8;
  
  lVar3 = *(long *)index;
  lVar5 = *(long *)(index + 8) - lVar3 >> 4;
  if (lVar5 <= in_RDX) {
    plVar7 = *(long **)(index + 0x18);
    do {
      lVar6 = lVar5;
      if (plVar7 == *(long **)(index + 0x20)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = &__cxxabiv1::__pointer_type_info::vtable;
        __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
      }
      lVar3 = *plVar7;
      lVar5 = (plVar7[1] - lVar3 >> 4) + lVar6;
      plVar7 = plVar7 + 3;
    } while (lVar5 <= in_RDX);
    in_RDX = in_RDX - lVar6;
  }
  puVar4 = (undefined8 *)(lVar3 + in_RDX * 0x10);
  pMVar1 = (pointer)*puVar4;
  pMVar2 = (pointer)puVar4[1];
  (this->outer_path).
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pMVar1;
  (this->outer_path).
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0] =
       (double)pMVar1;
  return (Vector)VVar8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                 .array;
}

Assistant:

Vector vertex(Index index) const
    {
        if (index < length(outer_path)) {
            return outer_path[index];
        }

        Index offset = length(outer_path);

        for (const auto& path : inner_paths) {
            if (index < offset + length(path)) {
                return path[index - offset];
            }

            offset += length(path);
        }

        throw std::exception();
    }